

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

_Bool av1_alloc_layer_context(AV1_COMP *cpi,int num_layers)

{
  _Bool _Var1;
  LAYER_CONTEXT *pLVar2;
  
  pLVar2 = (cpi->svc).layer_context;
  if ((pLVar2 == (LAYER_CONTEXT *)0x0) ||
     (_Var1 = true, (cpi->svc).num_allocated_layers < num_layers)) {
    aom_free(pLVar2);
    (cpi->svc).num_allocated_layers = 0;
    pLVar2 = (LAYER_CONTEXT *)aom_calloc((long)num_layers,0x3380);
    (cpi->svc).layer_context = pLVar2;
    if (pLVar2 == (LAYER_CONTEXT *)0x0) {
      _Var1 = false;
    }
    else {
      (cpi->svc).num_allocated_layers = num_layers;
      _Var1 = true;
    }
  }
  return _Var1;
}

Assistant:

bool av1_alloc_layer_context(AV1_COMP *cpi, int num_layers) {
  SVC *const svc = &cpi->svc;
  if (svc->layer_context == NULL || svc->num_allocated_layers < num_layers) {
    assert(num_layers > 1);
    aom_free(svc->layer_context);
    svc->num_allocated_layers = 0;
    svc->layer_context =
        (LAYER_CONTEXT *)aom_calloc(num_layers, sizeof(*svc->layer_context));
    if (svc->layer_context == NULL) return false;
    svc->num_allocated_layers = num_layers;
  }
  return true;
}